

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupInvMiter(Gia_Man_t *p,Gia_Man_t *pInv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  Vec_Int_t *pVVar6;
  Gia_Obj_t *pGVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  Gia_Man_t *p_00;
  size_t sVar13;
  char *pcVar14;
  Gia_Obj_t *pGVar15;
  Gia_Man_t *pGVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  Gia_Obj_t *pGVar20;
  
  if (p->nRegs < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x43c,"Gia_Man_t *Gia_ManDupInvMiter(Gia_Man_t *, Gia_Man_t *)");
  }
  if (pInv->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(pInv) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x43d,"Gia_Man_t *Gia_ManDupInvMiter(Gia_Man_t *, Gia_Man_t *)");
  }
  if (pInv->vCos->nSize != 1) {
    __assert_fail("Gia_ManCoNum(pInv) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x43e,"Gia_Man_t *Gia_ManDupInvMiter(Gia_Man_t *, Gia_Man_t *)");
  }
  if (p->nRegs != pInv->vCis->nSize) {
    __assert_fail("Gia_ManRegNum(p) == Gia_ManCiNum(pInv)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x43f,"Gia_Man_t *Gia_ManDupInvMiter(Gia_Man_t *, Gia_Man_t *)");
  }
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(pInv->nObjs * 2 + p->nObjs);
  pcVar5 = p->pName;
  if (pcVar5 == (char *)0x0) {
    pcVar14 = (char *)0x0;
  }
  else {
    sVar13 = strlen(pcVar5);
    pcVar14 = (char *)malloc(sVar13 + 1);
    strcpy(pcVar14,pcVar5);
  }
  p_00->pName = pcVar14;
  pcVar5 = p->pSpec;
  if (pcVar5 == (char *)0x0) {
    pcVar14 = (char *)0x0;
  }
  else {
    sVar13 = strlen(pcVar5);
    pcVar14 = (char *)malloc(sVar13 + 1);
    strcpy(pcVar14,pcVar5);
  }
  p_00->pSpec = pcVar14;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  iVar12 = p->nObjs;
  if (1 < iVar12) {
    lVar19 = 1;
    lVar17 = 0x14;
    do {
      pGVar20 = p->pObjs;
      uVar18 = *(ulong *)((long)pGVar20 + lVar17 + -8);
      uVar9 = (uint)uVar18;
      iVar12 = (int)(uVar18 & 0x1fffffff);
      if ((uVar18 & 0x1fffffff) == 0x1fffffff || (int)uVar9 < 0) {
        if ((uVar9 & 0x9fffffff) == 0x9fffffff) {
          pGVar15 = Gia_ManAppendObj(p_00);
          uVar18 = *(ulong *)pGVar15;
          *(ulong *)pGVar15 = uVar18 | 0x9fffffff;
          *(ulong *)pGVar15 =
               uVar18 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar7 = p_00->pObjs;
          if ((pGVar15 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar15)) {
LAB_001de070:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar15 - (long)pGVar7) >> 2) * -0x55555555);
          pGVar7 = p_00->pObjs;
          if ((pGVar15 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar15)) goto LAB_001de070;
          uVar8 = (int)((ulong)((long)pGVar15 - (long)pGVar7) >> 2) * 0x55555556;
          goto LAB_001ddc6c;
        }
        if ((int)uVar9 < 0 && iVar12 != 0x1fffffff) {
          uVar8 = *(uint *)((long)pGVar20 + lVar17 + (ulong)(uint)(iVar12 << 2) * -3);
          if (-1 < (int)uVar8) {
            uVar8 = uVar8 ^ uVar9 >> 0x1d & 1;
            goto LAB_001ddc6c;
          }
          goto LAB_001de051;
        }
      }
      else {
        uVar9 = *(uint *)((long)pGVar20 + lVar17 + (ulong)(uint)(iVar12 << 2) * -3);
        if (((int)uVar9 < 0) ||
           (uVar8 = *(uint *)((long)pGVar20 +
                             lVar17 + (ulong)((uint)(uVar18 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar8 < 0)) goto LAB_001de051;
        uVar8 = Gia_ManHashAnd(p_00,uVar9 ^ (uint)(uVar18 >> 0x1d) & 1,
                               uVar8 ^ (uint)(uVar18 >> 0x3d) & 1);
LAB_001ddc6c:
        *(uint *)(&pGVar20->field_0x0 + lVar17) = uVar8;
      }
      lVar19 = lVar19 + 1;
      iVar12 = p->nObjs;
      lVar17 = lVar17 + 0xc;
    } while (lVar19 < iVar12);
  }
  iVar1 = p->nRegs;
  if (0 < (long)iVar1) {
    pVVar6 = p->vCis;
    iVar2 = pVVar6->nSize;
    uVar18 = (ulong)(uint)(iVar2 - iVar1);
    lVar17 = 0;
    do {
      if (((int)uVar18 < 0) || (iVar2 <= (int)uVar18)) goto LAB_001de032;
      iVar3 = pVVar6->pArray[uVar18];
      if (((long)iVar3 < 0) || (iVar12 <= iVar3)) goto LAB_001de013;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (pInv->vCis->nSize <= lVar17) goto LAB_001de032;
      iVar4 = pInv->vCis->pArray[lVar17];
      if (((long)iVar4 < 0) || (pInv->nObjs <= iVar4)) goto LAB_001de013;
      pInv->pObjs[iVar4].Value = p->pObjs[iVar3].Value;
      lVar17 = lVar17 + 1;
      uVar18 = uVar18 + 1;
    } while (iVar1 != lVar17);
  }
  iVar12 = pInv->nObjs;
  if ((0 < iVar12) && (pGVar20 = pInv->pObjs, pGVar20 != (Gia_Obj_t *)0x0)) {
    lVar17 = 0;
    do {
      uVar18 = *(ulong *)pGVar20;
      if ((uVar18 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar18) {
        if ((int)pGVar20[-(uVar18 & 0x1fffffff)].Value < 0) goto LAB_001de051;
        uVar9 = (uint)(uVar18 >> 0x20);
        if ((int)pGVar20[-(ulong)(uVar9 & 0x1fffffff)].Value < 0) goto LAB_001de051;
        uVar9 = Gia_ManHashAnd(p_00,pGVar20[-(uVar18 & 0x1fffffff)].Value ^
                                    (uint)(uVar18 >> 0x1d) & 1,
                               pGVar20[-(ulong)(uVar9 & 0x1fffffff)].Value ^ uVar9 >> 0x1d & 1);
        pGVar20->Value = uVar9;
      }
      lVar17 = lVar17 + 1;
      iVar12 = pInv->nObjs;
    } while ((lVar17 < iVar12) && (pGVar20 = pInv->pObjs + lVar17, pInv->pObjs != (Gia_Obj_t *)0x0))
    ;
  }
  if (pInv->vCos->nSize < 1) {
LAB_001de032:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar1 = *pInv->vCos->pArray;
  if (((long)iVar1 < 0) || (iVar12 <= iVar1)) {
LAB_001de013:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar7 = pInv->pObjs;
  pGVar20 = pGVar7 + iVar1;
  uVar8 = (uint)*(undefined8 *)pGVar20;
  uVar9 = pGVar20[-(ulong)(uVar8 & 0x1fffffff)].Value;
  if (-1 < (int)uVar9) {
    iVar1 = p->nRegs;
    if (0 < (long)iVar1) {
      pVVar6 = p->vCos;
      iVar2 = pVVar6->nSize;
      uVar18 = (ulong)(uint)(iVar2 - iVar1);
      lVar17 = 0;
      do {
        if (((int)uVar18 < 0) || (iVar2 <= (int)uVar18)) goto LAB_001de032;
        iVar3 = pVVar6->pArray[uVar18];
        if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_001de013;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        if (pInv->vCis->nSize <= lVar17) goto LAB_001de032;
        iVar4 = pInv->vCis->pArray[lVar17];
        if (((long)iVar4 < 0) || (iVar12 <= iVar4)) goto LAB_001de013;
        pGVar7[iVar4].Value = p->pObjs[iVar3].Value;
        lVar17 = lVar17 + 1;
        uVar18 = uVar18 + 1;
      } while (iVar1 != lVar17);
    }
    iVar12 = pInv->nObjs;
    if ((0 < iVar12) && (pGVar20 = pInv->pObjs, pGVar20 != (Gia_Obj_t *)0x0)) {
      lVar17 = 0;
      do {
        uVar18 = *(ulong *)pGVar20;
        if ((uVar18 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar18) {
          if ((int)pGVar20[-(uVar18 & 0x1fffffff)].Value < 0) goto LAB_001de051;
          uVar10 = (uint)(uVar18 >> 0x20);
          if ((int)pGVar20[-(ulong)(uVar10 & 0x1fffffff)].Value < 0) goto LAB_001de051;
          uVar10 = Gia_ManHashAnd(p_00,pGVar20[-(uVar18 & 0x1fffffff)].Value ^
                                       (uint)(uVar18 >> 0x1d) & 1,
                                  pGVar20[-(ulong)(uVar10 & 0x1fffffff)].Value ^ uVar10 >> 0x1d & 1)
          ;
          pGVar20->Value = uVar10;
        }
        lVar17 = lVar17 + 1;
        iVar12 = pInv->nObjs;
      } while ((lVar17 < iVar12) &&
              (pGVar20 = pInv->pObjs + lVar17, pInv->pObjs != (Gia_Obj_t *)0x0));
    }
    if (pInv->vCos->nSize < 1) goto LAB_001de032;
    iVar1 = *pInv->vCos->pArray;
    if (((long)iVar1 < 0) || (iVar12 <= iVar1)) goto LAB_001de013;
    uVar11 = (uint)*(undefined8 *)(pInv->pObjs + iVar1);
    uVar10 = (pInv->pObjs + iVar1)[-(ulong)(uVar11 & 0x1fffffff)].Value;
    if (-1 < (int)uVar10) {
      iVar12 = Gia_ManHashAnd(p_00,uVar8 >> 0x1d & 1 ^ uVar9,uVar10 ^ uVar11 >> 0x1d & 1 ^ 1);
      Gia_ManAppendCo(p_00,iVar12);
      pGVar16 = Gia_ManCleanup(p_00);
      Gia_ManStop(p_00);
      return pGVar16;
    }
  }
LAB_001de051:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                ,0x132,"int Abc_LitNotCond(int, int)");
}

Assistant:

Gia_Man_t * Gia_ManDupInvMiter( Gia_Man_t * p, Gia_Man_t * pInv )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, Node1, Node2, Node;
    assert( Gia_ManRegNum(p) > 0 );
    assert( Gia_ManRegNum(pInv) == 0 );
    assert( Gia_ManCoNum(pInv) == 1 );
    assert( Gia_ManRegNum(p) == Gia_ManCiNum(pInv) );
    Gia_ManFillValue(p);
    pNew = Gia_ManStart( Gia_ManObjNum(p) + 2*Gia_ManObjNum(pInv) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ObjFanin0Copy(pObj);
    }
    // build invariant on top of register outputs in the first frame
    Gia_ManForEachRo( p, pObj, i )
        Gia_ManCi(pInv, i)->Value = pObj->Value;
    Gia_ManForEachAnd( pInv, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    pObj = Gia_ManCo( pInv, 0 );
    Node1 = Gia_ObjFanin0Copy(pObj);
    // build invariant on top of register outputs in the second frame
    Gia_ManForEachRi( p, pObj, i )
        Gia_ManCi(pInv, i)->Value = pObj->Value;
    Gia_ManForEachAnd( pInv, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    pObj = Gia_ManCo( pInv, 0 );
    Node2 = Gia_ObjFanin0Copy(pObj);
    // create miter output
    Node = Gia_ManHashAnd( pNew, Node1, Abc_LitNot(Node2) );
    Gia_ManAppendCo( pNew, Node );
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}